

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void __thiscall Reader::splittokens(Reader *this)

{
  LpSectionKeyword LVar1;
  ProcessedToken *pPVar2;
  key_type kVar3;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  bool condition;
  mapped_type *pmVar4;
  size_type sVar5;
  ProcessedToken *pPVar6;
  ProcessedToken *pPVar7;
  ProcessedToken *pPVar8;
  ProcessedToken *pPVar9;
  ProcessedToken *pPVar10;
  bool condition_00;
  LpSectionKeyword currentsection;
  key_type local_44;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *local_40;
  Reader *local_38;
  
  local_44 = NONE;
  pPVar8 = (this->processedtokens).
           super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = &this->sectiontokens;
  condition_00 = false;
  pPVar9 = pPVar8;
  pPVar2 = pPVar8;
  local_38 = this;
  while( true ) {
    kVar3 = local_44;
    pPVar10 = pPVar2 + 1;
    pPVar6 = (local_38->processedtokens).
             super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar2 == pPVar6) break;
    if (pPVar2->type == SECID) {
      LVar1 = (pPVar2->field_1).keyword;
      pPVar7 = pPVar9;
      if ((local_44 != NONE) && (local_44 != LVar1)) {
        lpassert(condition_00);
        pmVar4 = std::
                 map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                 ::operator[](local_40,&local_44);
        (pmVar4->second)._M_current = pPVar9;
        local_44 = NONE;
        pPVar6 = (local_38->processedtokens).
                 super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        condition_00 = false;
        pPVar7 = pPVar8;
      }
      this_00 = local_40;
      if ((pPVar10 == pPVar6) || (pPVar10->type == SECID)) {
        if ((local_44 != NONE) && (local_44 != pPVar2[1].field_1.keyword)) {
          lpassert(condition_00);
          pmVar4 = std::
                   map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   ::operator[](local_40,&local_44);
          (pmVar4->second)._M_current = pPVar7;
          condition_00 = false;
        }
        local_44 = NONE;
        condition = (bool)(condition_00 ^ 1);
      }
      else {
        if (kVar3 != LVar1) {
          local_44 = (pPVar2->field_1).keyword;
          sVar5 = std::
                  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                  ::count(local_40,&local_44);
          lpassert(sVar5 == 0);
          lpassert((bool)(~condition_00 & 1));
          pmVar4 = std::
                   map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   ::operator[](this_00,&local_44);
          (pmVar4->first)._M_current = pPVar9 + 1;
          condition_00 = true;
        }
        condition = (bool)(local_44 == NONE ^ condition_00);
      }
      lpassert(condition);
    }
    pPVar8 = pPVar8 + 1;
    pPVar9 = pPVar9 + 1;
    pPVar2 = pPVar10;
  }
  lpassert(local_44 == NONE);
  return;
}

Assistant:

void Reader::splittokens() {
  LpSectionKeyword currentsection = LpSectionKeyword::NONE;

  bool debug_open_section = false;
  for (std::vector<ProcessedToken>::iterator it(processedtokens.begin());
       it != processedtokens.end(); ++it) {
    // Look for section keywords
    if (it->type != ProcessedTokenType::SECID) continue;
    // currentsection is initially LpSectionKeyword::NONE, so the
    // first section ID will be a new section type
    //
    // Only record change of section and check for repeated
    // section if the keyword is for a different section. Allows
    // repetition of Integers and General (cf #1299) for example
    const bool new_section_type = currentsection != it->keyword;
    if (new_section_type) {
      if (currentsection != LpSectionKeyword::NONE) {
        // Current section is non-trivial, so mark its end, using the
        // value of currentsection to indicate that there is no open
        // section
        lpassert(debug_open_section);
        sectiontokens[currentsection].second = it;
        debug_open_section = false;
        currentsection = LpSectionKeyword::NONE;
      }
    }
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    if (next == processedtokens.end() ||
        next->type == ProcessedTokenType::SECID) {
      // Reached the end of the tokens or the new section is empty
      //
      // currentsection will be LpSectionKeyword::NONE unless the
      // second of two sections of the same type is empty and the
      // next section is of a new type, in which case mark the end of
      // the current section
      if (currentsection != LpSectionKeyword::NONE &&
          currentsection != next->keyword) {
        lpassert(debug_open_section);
        sectiontokens[currentsection].second = it;
        debug_open_section = false;
      }
      currentsection = LpSectionKeyword::NONE;
      lpassert(!debug_open_section);
      continue;
    }
    // Next section is non-empty
    if (new_section_type) {
      // Section type change
      currentsection = it->keyword;
      // Make sure the new section type has not occurred previously
      lpassert(sectiontokens.count(currentsection) == 0);
      // Remember the beginning of the new section: its the token
      // following the current one
      lpassert(!debug_open_section);
      sectiontokens[currentsection].first = next;
      debug_open_section = true;
    }
    // Always ends with either an open section or a section type of
    // LpSectionKeyword::NONE
    lpassert(debug_open_section != (currentsection == LpSectionKeyword::NONE));
  }
  // Check that the last section has been closed
  lpassert(currentsection == LpSectionKeyword::NONE);
}